

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_read_group(fitsfile *ff,char *grpname,int parent_hn)

{
  int iVar1;
  size_t sVar2;
  NGP_TOKEN *newtok;
  int in_EDX;
  fitsfile *in_RSI;
  fitsfile *in_RDI;
  NGP_HDU ngph;
  char incrementor_name [80];
  char grnm [80];
  int incrementor_index;
  int tmp0;
  int my_hn;
  int l;
  int exitflg;
  int r;
  int in_stack_00001f10;
  int in_stack_00001f14;
  fitsfile *in_stack_00001f18;
  int *in_stack_00002730;
  int in_stack_0000273c;
  fitsfile *in_stack_00002740;
  fitsfile *in_stack_00002748;
  int *in_stack_00005ce8;
  int in_stack_00005cf4;
  fitsfile *in_stack_00005cf8;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  uint uVar3;
  int in_stack_ffffffffffffff2c;
  NGP_HDU *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  uint local_34;
  int local_2c;
  int local_28;
  int iVar4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar3 = in_stack_ffffffffffffff28 & 0xffffff00;
  local_34 = 6;
  ngp_grplevel = ngp_grplevel + 1;
  iVar1 = ngp_hdu_init((NGP_HDU *)&stack0xffffffffffffff18);
  if ((iVar1 == 0) &&
     (iVar1 = ffgtcr((fitsfile *)CONCAT44(in_stack_ffffffffffffff2c,uVar3),
                     (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10), iVar1 == 0)) {
    ffghdn(in_RDI,&local_2c);
    if (0 < in_EDX) {
      ffmahd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
      ffgtam(in_stack_00002748,in_stack_00002740,in_stack_0000273c,in_stack_00002730);
      ffmahd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    iVar4 = 0;
    do {
      if ((iVar4 != 0) || (iVar1 = ngp_read_line(in_stack_ffffffffffffff20), iVar1 != 0)) break;
      newtok = (NGP_TOKEN *)(ulong)(ngp_keyidx - 1);
      switch(newtok) {
      case (NGP_TOKEN *)0x0:
        if (ngp_linkey.type == 2) {
          strncpy(&stack0xffffffffffffff78,ngp_linkey.value.s,0x50);
        }
        else {
          master_grp_idx = master_grp_idx + 1;
          snprintf(&stack0xffffffffffffff78,0x50,"DEFAULT_GROUP_%d");
        }
        iVar1 = ngp_read_group(in_RSI,(char *)CONCAT44(in_EDX,iVar1),iVar4);
        break;
      case (NGP_TOKEN *)0x1:
        ngp_grplevel = ngp_grplevel + -1;
        iVar4 = 1;
        break;
      case (NGP_TOKEN *)0x2:
        iVar1 = ngp_unread_line();
        if (iVar1 == 0) {
          iVar1 = ngp_read_xtension(in_stack_00001f18,in_stack_00001f14,in_stack_00001f10);
        }
        break;
      case (NGP_TOKEN *)0x3:
      case (NGP_TOKEN *)0x4:
        iVar1 = 0x171;
        break;
      default:
        sVar2 = strlen(ngp_linkey.name);
        local_28 = (int)sVar2;
        if (((1 < local_28) && (local_28 < 7)) && (ngp_linkey.name[local_28 + -1] == '#')) {
          if ((char)uVar3 == '\0') {
            memcpy(&stack0xffffffffffffff28,ngp_linkey.name,(long)(local_28 + -1));
            (&stack0xffffffffffffff28)[local_28 + -1] = 0;
          }
          in_stack_ffffffffffffff0c = local_28 + -1;
          sVar2 = strlen(&stack0xffffffffffffff28);
          if ((in_stack_ffffffffffffff0c == (int)sVar2) &&
             (iVar1 = memcmp(&stack0xffffffffffffff28,ngp_linkey.name,(long)(local_28 + -1)),
             iVar1 == 0)) {
            local_34 = local_34 + 1;
          }
          snprintf(ngp_linkey.name + (long)local_28 + -1,(long)(0x4c - local_28),"%d",
                   (ulong)local_34);
        }
        iVar1 = ngp_hdu_insert_token
                          ((NGP_HDU *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           newtok);
      }
    } while (iVar1 == 0);
    iVar4 = (int)((ulong)in_RSI >> 0x20);
    ffmahd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
           in_stack_ffffffffffffff70);
    if (iVar1 == 0) {
      iVar1 = ngp_append_columns(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                 in_stack_ffffffffffffff2c);
    }
    if (iVar1 == 0) {
      iVar1 = ngp_keyword_all_write
                        ((NGP_HDU *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,iVar4);
    }
    if (iVar1 != 0) {
      ffgtrm(in_stack_00005cf8,in_stack_00005cf4,in_stack_00005ce8);
    }
    ngp_hdu_clear((NGP_HDU *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  return iVar1;
}

Assistant:

int	ngp_read_group(fitsfile *ff, char *grpname, int parent_hn)
 { int		r, exitflg, l, my_hn, tmp0, incrementor_index;
   char		grnm[NGP_MAX_STRING];			/* keyword holding group name */
   char		incrementor_name[NGP_MAX_STRING];
   NGP_HDU	ngph;

   incrementor_name[0] = 0;			/* signal no keyword+'#' found yet */
   incrementor_index = 6;			/* first 6 cols are used by group */

   ngp_grplevel++;
   if (NGP_OK != (r = ngp_hdu_init(&ngph))) return(r);

   r = NGP_OK;
   if (NGP_OK != (r = fits_create_group(ff, grpname, GT_ID_ALL_URI, &r))) return(r);
   fits_get_hdu_num(ff, &my_hn);
   if (parent_hn > 0)
     { fits_movabs_hdu(ff, parent_hn, &tmp0, &r);	/* link us to parent */
       fits_add_group_member(ff, NULL, my_hn, &r);
       fits_movabs_hdu(ff, my_hn, &tmp0, &r);
       if (NGP_OK != r) return(r);
     }

   for (exitflg = 0; 0 == exitflg;)
    { if (NGP_OK != (r = ngp_read_line(0))) break;	/* EOF always means error here */
      switch (ngp_keyidx)
       {
	 case NGP_TOKEN_SIMPLE:
	 case NGP_TOKEN_EOF:
			r = NGP_TOKEN_NOT_EXPECT;
			break;

         case NGP_TOKEN_END:
         		ngp_grplevel--;
			exitflg = 1;
			break;

         case NGP_TOKEN_GROUP:
			if (NGP_TTYPE_STRING == ngp_linkey.type)
			  { strncpy(grnm, ngp_linkey.value.s, NGP_MAX_STRING);
			  }
			else
			  { snprintf(grnm, NGP_MAX_STRING,"DEFAULT_GROUP_%d", master_grp_idx++);
			  }
			grnm[NGP_MAX_STRING - 1] = 0;
			r = ngp_read_group(ff, grnm, my_hn);
			break;			/* we can have many subsequent GROUP defs */

         case NGP_TOKEN_XTENSION:
         		r = ngp_unread_line();
         		if (NGP_OK != r) break;
         		r = ngp_read_xtension(ff, my_hn, 0);
			break;			/* we can have many subsequent HDU defs */

         default:	l = strlen(ngp_linkey.name);
			if ((l >= 2) && (l <= 6))
			  { if ('#' == ngp_linkey.name[l - 1])
			      { if (0 == incrementor_name[0])
			          { memcpy(incrementor_name, ngp_linkey.name, l - 1);
			            incrementor_name[l - 1] = 0;
			          }
			        if (((l - 1) == (int)strlen(incrementor_name)) && (0 == memcmp(incrementor_name, ngp_linkey.name, l - 1)))
			          { incrementor_index++;
			          }
			        snprintf(ngp_linkey.name + l - 1, NGP_MAX_NAME-l+1,"%d", incrementor_index);
			      }
			  }
         		r = ngp_hdu_insert_token(&ngph, &ngp_linkey); 
			break;			/* here we can add keyword */
       }
      if (NGP_OK != r) break;
    }

   fits_movabs_hdu(ff, my_hn, &tmp0, &r);	/* back to our HDU */

   if (NGP_OK == r)				/* create additional columns, if requested */
     r = ngp_append_columns(ff, &ngph, 6);

   if (NGP_OK == r)				/* and write keywords */
     r = ngp_keyword_all_write(&ngph, ff, NGP_NON_SYSTEM_ONLY);

   if (NGP_OK != r)			/* delete group in case of error */
     { tmp0 = 0;
       fits_remove_group(ff, OPT_RM_GPT, &tmp0);
     }

   ngp_hdu_clear(&ngph);		/* we are done with this HDU, so delete it */
   return(r);
 }